

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zuncompress.c
# Opt level: O0

int zuncompress2mem(char *filename,FILE *indiskfile,char **buffptr,size_t *buffsize,
                   _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  int iVar2;
  uch local_4c;
  undefined2 local_42;
  char magic [2];
  size_t *filesize_local;
  _func_void_ptr_void_ptr_size_t *mem_realloc_local;
  size_t *buffsize_local;
  char **buffptr_local;
  FILE *indiskfile_local;
  char *filename_local;
  
  if (*status < 1) {
    ifname[0] = '\0';
    strncat(ifname,filename,0x7f);
    inptr = 0;
    insize = 0;
    bytes_out = 0;
    bytes_in = 0;
    ifd = indiskfile;
    memptr = buffptr;
    memsize = buffsize;
    realloc_fn = mem_realloc;
    iVar2 = fill_inbuf(0);
    if (inptr < insize) {
      local_4c = inbuf[inptr];
      inptr = inptr + 1;
    }
    else {
      iVar1 = fill_inbuf(0);
      local_4c = (uch)iVar1;
    }
    local_42 = CONCAT11(local_4c,(char)iVar2);
    if (local_42 == -0x62e1) {
      work = unlzw;
      method = 1;
      last_member = 1;
      iVar2 = unlzw(ifd,ofd);
      if (iVar2 != 0) {
        method = -1;
        *status = 0x19e;
      }
      if (filesize != (size_t *)0x0) {
        *filesize = bytes_out;
      }
      filename_local._4_4_ = *status;
    }
    else {
      error("ERROR: input .Z file is in unrecognized compression format.\n");
      filename_local._4_4_ = -1;
    }
  }
  else {
    filename_local._4_4_ = *status;
  }
  return filename_local._4_4_;
}

Assistant:

int zuncompress2mem(char *filename,  /* name of input file                 */
             FILE *indiskfile,     /* I - file pointer                        */
             char **buffptr,   /* IO - memory pointer                     */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the file into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    char magic[2]; /* magic header */

    if (*status > 0)
        return(*status);

    /*  save input parameters into global variables */
    ifname[0] = '\0';
    strncat(ifname, filename, 127);
    ifd = indiskfile;
    memptr = (void **) buffptr;
    memsize = buffsize;
    realloc_fn = mem_realloc;

    /* clear input and output buffers */

    insize = inptr = 0;
    bytes_in = bytes_out = 0L;

    magic[0] = (char)get_byte();
    magic[1] = (char)get_byte();

    if (memcmp(magic, LZW_MAGIC, 2) != 0) {
      error("ERROR: input .Z file is in unrecognized compression format.\n");
      return(-1);
    }

    work = unlzw;
    method = COMPRESSED;
    last_member = 1;

    /* do the uncompression */
    if ((*work)(ifd, ofd) != OK) {
        method = -1; /* force cleanup */
        *status = 414;    /* report some sort of decompression error */
    }

    if (filesize)  *filesize = bytes_out;

    return(*status);
}